

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-summon.c
# Opt level: O0

errr finish_parse_summon(parser *p)

{
  summon *psVar1;
  wchar_t wVar2;
  char *name;
  wchar_t index;
  summon *next;
  summon *summon;
  parser *p_local;
  
  summon_max = L'\0';
  for (next = (summon *)parser_priv(p); next != (summon *)0x0; next = next->next) {
    summon_max = summon_max + L'\x01';
  }
  summons = (summon *)mem_zalloc((long)(summon_max + L'\x01') << 6);
  name._4_4_ = summon_max;
  next = (summon *)parser_priv(p);
  while (name._4_4_ = name._4_4_ + L'\xffffffff', next != (summon *)0x0) {
    memcpy(summons + name._4_4_,next,0x40);
    psVar1 = next->next;
    summons[name._4_4_].next = (summon *)0x0;
    mem_free(next);
    next = psVar1;
  }
  summon_max = summon_max + L'\x01';
  for (name._4_4_ = L'\0'; name._4_4_ < summon_max; name._4_4_ = name._4_4_ + L'\x01') {
    wVar2 = summon_name_to_idx(summons[name._4_4_].fallback_name);
    summons[name._4_4_].fallback = wVar2;
  }
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_summon(struct parser *p) {
	struct summon *summon, *next;
	int index;

	/* Count the entries */
	summon_max = 0;
	summon = parser_priv(p);
	while (summon) {
		summon_max++;
		summon = summon->next;
	}

	/* Allocate the direct access list and copy the data to it */
	summons = mem_zalloc((summon_max + 1) * sizeof(*summon));
	index = summon_max - 1;
	for (summon = parser_priv(p); summon; summon = next, index--) {
		memcpy(&summons[index], summon, sizeof(*summon));
		next = summon->next;
		summons[index].next = NULL;

		mem_free(summon);
	}
	summon_max += 1;

	/* Add indices of fallback summons */
	for (index = 0; index < summon_max; index++) {
		char *name = summons[index].fallback_name;
		summons[index].fallback = summon_name_to_idx(name);
	}

	parser_destroy(p);
	return 0;
}